

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_helpers.cpp
# Opt level: O3

string * underscore_to_camel_case(string *__return_storage_ptr__,string *s)

{
  size_type sVar1;
  size_type sVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = s->_M_string_length;
  if (sVar1 != 1) {
    sVar2 = 1;
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string underscore_to_camel_case(const std::string &s) {
  std::string ret;
  for (size_t i = 0, end = s.size() - 1; i < end; ++i) {
    if (s[i] == '_') {
      ret += s[i + 1] ^ 32;
      continue;
    }
    ret += s[i];
  }
  return ret;
}